

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void __thiscall CESkyCoord::CESkyCoord(CESkyCoord *this,CECoordinates *other)

{
  CECoordinates *pCVar1;
  CECoordinateType CVar2;
  CECoordinates *in_RSI;
  undefined8 *in_RDI;
  CEAngle *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  double local_50;
  undefined1 local_48 [16];
  double local_38;
  undefined1 local_30 [32];
  CECoordinates *local_10;
  
  *in_RDI = &PTR__CESkyCoord_00159cd0;
  local_10 = in_RSI;
  CEAngle::CEAngle((CEAngle *)0x145f0c);
  CEAngle::CEAngle((CEAngle *)0x145f1f);
  pCVar1 = local_10;
  local_38 = CppEphem::julian_date_J2000();
  (*pCVar1->_vptr_CECoordinates[3])(local_30,pCVar1,&local_38);
  CEAngle::operator=((CEAngle *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
  CEAngle::~CEAngle((CEAngle *)0x145f80);
  pCVar1 = local_10;
  local_50 = CppEphem::julian_date_J2000();
  (*pCVar1->_vptr_CECoordinates[4])(local_48,pCVar1,&local_50);
  CEAngle::operator=((CEAngle *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
  CEAngle::~CEAngle((CEAngle *)0x145fdf);
  CVar2 = CECoordinates::GetCoordSystem(local_10);
  *(CECoordinateType *)(in_RDI + 5) = CVar2;
  return;
}

Assistant:

CESkyCoord::CESkyCoord(const CECoordinates& other)
{
    // Set coordinates
    xcoord_ = other.XCoord();
    ycoord_ = other.YCoord();
    coord_type_ = CESkyCoordType(int(other.GetCoordSystem()));
}